

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<VectorWriter,std::vector<CInv,std::allocator<CInv>>>
          (VectorFormatter<DefaultFormatter> *this,VectorWriter *s,
          vector<CInv,_std::allocator<CInv>_> *v)

{
  pointer pCVar1;
  size_t in_RCX;
  value_type *elem;
  pointer pCVar2;
  long in_FS_OFFSET;
  uint32_t local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<VectorWriter>
            (s,((long)(v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7);
  pCVar2 = (v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pCVar1 = (v->super__Vector_base<CInv,_std::allocator<CInv>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pCVar2 != pCVar1) {
    do {
      local_34 = pCVar2->type;
      VectorWriter::write(s,(int)&local_34,(void *)0x4,in_RCX);
      VectorWriter::write(s,(int)pCVar2 + 4,(void *)0x20,in_RCX);
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }